

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EthBasePort.cpp
# Opt level: O0

void EthBasePort::PrintDebugDataKSZ(ostream *debugStream,quadlet_t *data,double clockPeriod)

{
  bool bVar1;
  ostream *poVar2;
  void *pvVar3;
  double dVar4;
  double bits2uS;
  allocator<char> local_49;
  string local_48;
  quadlet_t *local_28;
  DebugData *p;
  double clockPeriod_local;
  quadlet_t *data_local;
  ostream *debugStream_local;
  
  local_28 = data;
  p = (DebugData *)clockPeriod;
  clockPeriod_local = (double)data;
  data_local = (quadlet_t *)debugStream;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,"PrintDebugDataKSZ",&local_49);
  bVar1 = CheckDebugHeader(debugStream,&local_48,(char *)local_28,2);
  std::__cxx11::string::~string((string *)&local_48);
  std::allocator<char>::~allocator(&local_49);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    std::operator<<((ostream *)data_local,"*** KSZ: ");
    if ((*(ushort *)((long)local_28 + 6) & 0x8000) != 0) {
      std::operator<<((ostream *)data_local,"isDMAWrite ");
    }
    if ((*(ushort *)((long)local_28 + 6) & 0x4000) != 0) {
      std::operator<<((ostream *)data_local,"sendRequest ");
    }
    if ((*(ushort *)((long)local_28 + 6) & 0x2000) != 0) {
      std::operator<<((ostream *)data_local,"IRQ ");
    }
    if ((*(ushort *)((long)local_28 + 6) & 0x1000) != 0) {
      std::operator<<((ostream *)data_local,"isInIRQ ");
    }
    if ((*(ushort *)((long)local_28 + 6) & 0x800) != 0) {
      std::operator<<((ostream *)data_local,"link-on ");
    }
    std::ostream::operator<<(data_local,std::endl<char,std::char_traits<char>>);
    poVar2 = std::operator<<((ostream *)data_local,"State: ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,(ushort)*(byte *)((long)local_28 + 0xb));
    poVar2 = std::operator<<(poVar2,", nextState: ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,(ushort)*(byte *)((long)local_28 + 9));
    poVar2 = std::operator<<(poVar2,", retState: ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,(ushort)*(byte *)((long)local_28 + 10));
    poVar2 = std::operator<<(poVar2,", PC: ");
    pvVar3 = (void *)std::ostream::operator<<(poVar2,(ushort)(byte)local_28[2]);
    std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
    poVar2 = std::operator<<((ostream *)data_local,"RegISROther: ");
    pvVar3 = (void *)std::ostream::operator<<(poVar2,std::hex);
    pvVar3 = (void *)std::ostream::operator<<(pvVar3,(ushort)local_28[3]);
    std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
    poVar2 = std::operator<<((ostream *)data_local,"FrameCount: ");
    pvVar3 = (void *)std::ostream::operator<<(poVar2,std::dec);
    pvVar3 = (void *)std::ostream::operator<<(pvVar3,(ushort)*(byte *)((long)local_28 + 0x11));
    std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
    poVar2 = std::operator<<((ostream *)data_local,"numReset: ");
    pvVar3 = (void *)std::ostream::operator<<(poVar2,std::dec);
    pvVar3 = (void *)std::ostream::operator<<(pvVar3,(ushort)*(byte *)((long)local_28 + 0x1f));
    std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
    poVar2 = std::operator<<((ostream *)data_local,"numPacketValid: ");
    pvVar3 = (void *)std::ostream::operator<<(poVar2,std::dec);
    pvVar3 = (void *)std::ostream::operator<<(pvVar3,(ushort)local_28[7]);
    std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
    poVar2 = std::operator<<((ostream *)data_local,"numPacketInvalid: ");
    pvVar3 = (void *)std::ostream::operator<<(poVar2,std::dec);
    pvVar3 = (void *)std::ostream::operator<<(pvVar3,(ushort)*(byte *)((long)local_28 + 0x1e));
    std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
    poVar2 = std::operator<<((ostream *)data_local,"numPacketSent: ");
    pvVar3 = (void *)std::ostream::operator<<(poVar2,std::dec);
    pvVar3 = (void *)std::ostream::operator<<(pvVar3,(ushort)(byte)local_28[4]);
    std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
    poVar2 = std::operator<<((ostream *)data_local,"rxPktWords: ");
    pvVar3 = (void *)std::ostream::operator<<(poVar2,std::dec);
    pvVar3 = (void *)std::ostream::operator<<(pvVar3,(ushort)local_28[5]);
    std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
    poVar2 = std::operator<<((ostream *)data_local,"txPktWords: ");
    pvVar3 = (void *)std::ostream::operator<<(poVar2,std::dec);
    pvVar3 = (void *)std::ostream::operator<<(pvVar3,*(ushort *)((long)local_28 + 0x16));
    std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
    poVar2 = std::operator<<((ostream *)data_local,"respBytes: ");
    pvVar3 = (void *)std::ostream::operator<<(poVar2,*(ushort *)((long)local_28 + 0xe));
    std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
    dVar4 = (double)p * 1000000.0;
    poVar2 = std::operator<<((ostream *)data_local,"timeReceive (us): ");
    pvVar3 = (void *)std::ostream::operator<<(poVar2,(double)(ushort)local_28[6] * dVar4);
    std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
    poVar2 = std::operator<<((ostream *)data_local,"timeSend (us): ");
    pvVar3 = (void *)std::ostream::operator<<
                               (poVar2,(double)*(ushort *)((long)local_28 + 0x1a) * dVar4);
    std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
    poVar2 = std::operator<<((ostream *)data_local,"bw_wait: ");
    pvVar3 = (void *)std::ostream::operator<<(poVar2,std::dec);
    poVar2 = (ostream *)std::ostream::operator<<(pvVar3,*(ushort *)((long)local_28 + 0x12));
    poVar2 = std::operator<<(poVar2," (");
    poVar2 = (ostream *)
             std::ostream::operator<<(poVar2,(double)*(ushort *)((long)local_28 + 0x12) * dVar4);
    poVar2 = std::operator<<(poVar2," us)");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  }
  return;
}

Assistant:

void EthBasePort::PrintDebugDataKSZ(std::ostream &debugStream, const quadlet_t *data, double clockPeriod)
{
    // Following structure must match DebugData in KSZ8851.v
    struct DebugData {
        char     header[4];        // Quad 0
        uint16_t quad1_low;        // Quad 1
        uint16_t statusbits;
        uint8_t  runPC;            // Quad 2
        uint8_t  nextState;
        uint8_t  retState;
        uint8_t  state;
        uint16_t regISROther;      // Quad 3
        uint16_t respBytes;
        uint8_t  numPacketSent;    // Quad 4
        uint8_t  frameCount;
        uint16_t bw_wait;
        uint16_t rxPktWords;      // Quad 5
        uint16_t txPktWords;
        uint16_t timeReceive;     // Quad 6
        uint16_t timeSend;
        uint16_t numPacketValid;  // Quad 7
        uint8_t  numPacketInvalid;
        uint8_t  numReset;
        uint32_t unused[8];       // Unused (except if DEBOUNCE_STATES)
    };
    if (sizeof(DebugData) != 16*sizeof(quadlet_t)) {
        debugStream << "PrintDebugDataKSZ: structure packing problem" << std::endl;
        return;
    }
    const DebugData *p = reinterpret_cast<const DebugData *>(data);
    if (!CheckDebugHeader(debugStream, "PrintDebugDataKSZ", p->header, 2))
        return;

    debugStream << "*** KSZ: ";
    if (p->statusbits & 0x8000) debugStream << "isDMAWrite ";
    if (p->statusbits & 0x4000) debugStream << "sendRequest ";
    if (p->statusbits & 0x2000) debugStream << "IRQ ";
    if (p->statusbits & 0x1000) debugStream << "isInIRQ ";
    if (p->statusbits & 0x0800) debugStream << "link-on ";
    debugStream << std::endl;
    debugStream << "State: " << static_cast<uint16_t>(p->state)
                << ", nextState: " << static_cast<uint16_t>(p->nextState)
                << ", retState: " << static_cast<uint16_t> (p->retState)
                << ", PC: " << static_cast<uint16_t>(p->runPC) << std::endl;
    debugStream << "RegISROther: " << std::hex << p->regISROther << std::endl;
    debugStream << "FrameCount: " << std::dec << static_cast<uint16_t>(p->frameCount) << std::endl;
    debugStream << "numReset: " << std::dec << static_cast<uint16_t>(p->numReset) << std::endl;
    debugStream << "numPacketValid: " << std::dec << p->numPacketValid << std::endl;
    debugStream << "numPacketInvalid: " << std::dec << static_cast<uint16_t>(p->numPacketInvalid) << std::endl;
    debugStream << "numPacketSent: " << std::dec << static_cast<uint16_t>(p->numPacketSent) << std::endl;
    debugStream << "rxPktWords: " << std::dec << p->rxPktWords << std::endl;
    debugStream << "txPktWords: " << std::dec << p->txPktWords << std::endl;
    debugStream << "respBytes: " << p->respBytes << std::endl;
    const double bits2uS = clockPeriod*1e6;
    debugStream << "timeReceive (us): " << p->timeReceive*bits2uS << std::endl;
    debugStream << "timeSend (us): " << p->timeSend*bits2uS << std::endl;
    debugStream << "bw_wait: " << std::dec << p->bw_wait << " (" << p->bw_wait*bits2uS << " us)" << std::endl;
}